

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Pivot.c
# Opt level: O0

int Llb_ManTracePaths_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pPivot)

{
  bool bVar1;
  int iVar2;
  int local_40;
  int local_38;
  int local_34;
  int iFan;
  int k;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pPivot_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_38 = -1;
  iVar2 = Aig_ObjIsTravIdPrevious(p,pObj);
  if (iVar2 == 0) {
    iVar2 = Aig_ObjIsTravIdCurrent(p,pObj);
    if (iVar2 == 0) {
      iVar2 = Saig_ObjIsLi(p,pObj);
      if (iVar2 == 0) {
        iVar2 = Saig_ObjIsPo(p,pObj);
        if (iVar2 == 0) {
          if (pObj == pPivot) {
            p_local._4_4_ = 1;
          }
          else {
            iVar2 = Aig_ObjIsCand(pObj);
            if (iVar2 == 0) {
              __assert_fail("Aig_ObjIsCand(pObj)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Pivot.c"
                            ,0x3b,"int Llb_ManTracePaths_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)"
                           );
            }
            if (p->pFanData == (int *)0x0) {
              __assert_fail("p->pFanData",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb1Pivot.c"
                            ,0x3c,"int Llb_ManTracePaths_rec(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)"
                           );
            }
            local_34 = 0;
            while( true ) {
              bVar1 = false;
              if (local_34 < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
                if (local_34 == 0) {
                  local_40 = Aig_ObjFanout0Int(p,pObj->Id);
                }
                else {
                  local_40 = Aig_ObjFanoutNext(p,local_38);
                }
                local_38 = local_40;
                _iFan = Aig_ManObj(p,local_40 >> 1);
                bVar1 = true;
              }
              if (!bVar1) {
                Aig_ObjSetTravIdCurrent(p,pObj);
                return 1;
              }
              iVar2 = Llb_ManTracePaths_rec(p,_iFan,pPivot);
              if (iVar2 == 0) break;
              local_34 = local_34 + 1;
            }
            Aig_ObjSetTravIdPrevious(p,pObj);
            p_local._4_4_ = 0;
          }
        }
        else {
          p_local._4_4_ = 0;
        }
      }
      else {
        p_local._4_4_ = 0;
      }
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Llb_ManTracePaths_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pPivot )
{
    Aig_Obj_t * pFanout;
    int k, iFan = -1;
    if ( Aig_ObjIsTravIdPrevious(p, pObj) )
        return 0;
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return 1;
    if ( Saig_ObjIsLi(p, pObj) )
        return 0;
    if ( Saig_ObjIsPo(p, pObj) )
        return 0;
    if ( pObj == pPivot )
        return 1;
    assert( Aig_ObjIsCand(pObj) );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFan, k )
        if ( !Llb_ManTracePaths_rec( p, pFanout, pPivot ) )
        {
            Aig_ObjSetTravIdPrevious(p, pObj);
            return 0;
        }
    Aig_ObjSetTravIdCurrent(p, pObj);
    return 1;
}